

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

void av1_restore_uv_color_map(AV1_COMP *cpi,MACROBLOCK *x)

{
  long lVar1;
  long lVar2;
  long in_RSI;
  long in_RDI;
  int cols;
  int rows;
  int plane_block_height;
  int plane_block_width;
  uint16_t *src_v16;
  uint16_t *src_u16;
  int c;
  int r;
  uint8_t *color_map;
  int16_t centroids [16];
  int16_t *data;
  uint8_t *src_v;
  uint8_t *src_u;
  int src_stride;
  BLOCK_SIZE bsize;
  PALETTE_MODE_INFO *pmi;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int *cols_within_bounds;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int16_t *in_stack_ffffffffffffff70;
  int local_78;
  int local_74;
  undefined2 local_68 [16];
  long local_48;
  long local_40;
  long local_38;
  int local_30;
  BLOCK_SIZE local_29;
  BLOCK_SIZE *local_28;
  BLOCK_SIZE *local_20;
  MACROBLOCKD *local_18;
  long local_8;
  
  local_18 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  local_20 = (BLOCK_SIZE *)**(undefined8 **)(in_RSI + 0x2058);
  local_28 = local_20 + 0x5e;
  local_29 = *local_20;
  local_30 = *(int *)(in_RSI + 0xd0);
  local_38 = *(long *)(in_RSI + 0xb8);
  local_40 = *(long *)(in_RSI + 0x140);
  local_48 = *(long *)(in_RSI + 0x41c0) + 0x1000;
  lVar1 = local_38 * 2;
  lVar2 = local_40 * 2;
  cols_within_bounds = (int *)&stack0xffffffffffffff68;
  local_8 = in_RDI;
  av1_get_block_dimensions
            (local_29,1,local_18,(int *)&stack0xffffffffffffff74,(int *)&stack0xffffffffffffff70,
             (int *)&stack0xffffffffffffff6c,cols_within_bounds);
  for (local_74 = 0; local_74 < in_stack_ffffffffffffff6c; local_74 = local_74 + 1) {
    for (local_78 = 0; local_78 < in_stack_ffffffffffffff68; local_78 = local_78 + 1) {
      if (*(char *)(*(long *)(local_8 + 0x42008) + 0x4c) == '\0') {
        *(ushort *)(local_48 + (long)((local_74 * in_stack_ffffffffffffff68 + local_78) * 2) * 2) =
             (ushort)*(byte *)(local_38 + (local_74 * local_30 + local_78));
        *(ushort *)
         (local_48 + (long)((local_74 * in_stack_ffffffffffffff68 + local_78) * 2 + 1) * 2) =
             (ushort)*(byte *)(local_40 + (local_74 * local_30 + local_78));
      }
      else {
        *(undefined2 *)
         (local_48 + (long)((local_74 * in_stack_ffffffffffffff68 + local_78) * 2) * 2) =
             *(undefined2 *)(lVar1 + (long)(local_74 * local_30 + local_78) * 2);
        *(undefined2 *)
         (local_48 + (long)((local_74 * in_stack_ffffffffffffff68 + local_78) * 2 + 1) * 2) =
             *(undefined2 *)(lVar2 + (long)(local_74 * local_30 + local_78) * 2);
      }
    }
  }
  for (local_74 = 1; local_74 < 3; local_74 = local_74 + 1) {
    for (local_78 = 0; local_78 < (int)(uint)local_28[0x31]; local_78 = local_78 + 1) {
      local_68[local_78 * 2 + local_74 + -1] =
           *(undefined2 *)(local_28 + (long)(local_74 * 8 + local_78) * 2);
    }
  }
  av1_calc_indices(in_stack_ffffffffffffff70,
                   (int16_t *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (uint8_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (int)((ulong)cols_within_bounds >> 0x20),(int)cols_within_bounds,0);
  extend_palette_color_map
            ((uint8_t *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
             in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
  return;
}

Assistant:

void av1_restore_uv_color_map(const AV1_COMP *cpi, MACROBLOCK *x) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const BLOCK_SIZE bsize = mbmi->bsize;
  int src_stride = x->plane[1].src.stride;
  const uint8_t *const src_u = x->plane[1].src.buf;
  const uint8_t *const src_v = x->plane[2].src.buf;
  int16_t *const data = x->palette_buffer->kmeans_data_buf;
  int16_t centroids[2 * PALETTE_MAX_SIZE];
  uint8_t *const color_map = xd->plane[1].color_index_map;
  int r, c;
  const uint16_t *const src_u16 = CONVERT_TO_SHORTPTR(src_u);
  const uint16_t *const src_v16 = CONVERT_TO_SHORTPTR(src_v);
  int plane_block_width, plane_block_height, rows, cols;
  av1_get_block_dimensions(bsize, 1, xd, &plane_block_width,
                           &plane_block_height, &rows, &cols);

  for (r = 0; r < rows; ++r) {
    for (c = 0; c < cols; ++c) {
      if (cpi->common.seq_params->use_highbitdepth) {
        data[(r * cols + c) * 2] = src_u16[r * src_stride + c];
        data[(r * cols + c) * 2 + 1] = src_v16[r * src_stride + c];
      } else {
        data[(r * cols + c) * 2] = src_u[r * src_stride + c];
        data[(r * cols + c) * 2 + 1] = src_v[r * src_stride + c];
      }
    }
  }

  for (r = 1; r < 3; ++r) {
    for (c = 0; c < pmi->palette_size[1]; ++c) {
      centroids[c * 2 + r - 1] = pmi->palette_colors[r * PALETTE_MAX_SIZE + c];
    }
  }

  av1_calc_indices(data, centroids, color_map, rows * cols,
                   pmi->palette_size[1], 2);
  extend_palette_color_map(color_map, cols, rows, plane_block_width,
                           plane_block_height);
}